

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv.cpp
# Opt level: O0

int32_t find_root_descriptor_index
                  (Remapper *remapper,dxil_spv_d3d_binding *binding,
                  dxil_spv_resource_class resource_class)

{
  anon_class_16_2_e0c9f1a9_for__M_pred __pred;
  bool bVar1;
  difference_type dVar2;
  __normal_iterator<const_Remapper::RootDescriptor_*,_std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>_>
  local_60;
  __normal_iterator<const_Remapper::RootDescriptor_*,_std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>_>
  local_58;
  dxil_spv_resource_class *local_50;
  dxil_spv_d3d_binding **local_48;
  RootDescriptor *local_40;
  __normal_iterator<const_Remapper::RootDescriptor_*,_std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>_>
  local_38;
  __normal_iterator<const_Remapper::RootDescriptor_*,_std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>_>
  local_30;
  __normal_iterator<const_Remapper::RootDescriptor_*,_std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>_>
  itr;
  dxil_spv_d3d_binding *pdStack_20;
  dxil_spv_resource_class resource_class_local;
  dxil_spv_d3d_binding *binding_local;
  Remapper *remapper_local;
  
  itr._M_current._4_4_ = resource_class;
  pdStack_20 = binding;
  binding_local = (dxil_spv_d3d_binding *)remapper;
  local_38._M_current =
       (RootDescriptor *)
       std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>::begin
                 (&remapper->root_descriptors);
  local_40 = (RootDescriptor *)
             std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>::end
                       ((vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>
                         *)&binding_local[1].kind);
  local_50 = (dxil_spv_resource_class *)((long)&itr._M_current + 4);
  local_48 = &stack0xffffffffffffffe0;
  __pred.binding = local_48;
  __pred.resource_class = local_50;
  local_30 = std::
             find_if<__gnu_cxx::__normal_iterator<Remapper::RootDescriptor_const*,std::vector<Remapper::RootDescriptor,std::allocator<Remapper::RootDescriptor>>>,find_root_descriptor_index(Remapper_const*,dxil_spv_d3d_binding_const*,dxil_spv_resource_class)::__0>
                       (local_38,(__normal_iterator<const_Remapper::RootDescriptor_*,_std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>_>
                                  )local_40,__pred);
  local_58._M_current =
       (RootDescriptor *)
       std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>::end
                 ((vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_> *)
                  &binding_local[1].kind);
  bVar1 = __gnu_cxx::operator!=(&local_30,&local_58);
  if (bVar1) {
    local_60._M_current =
         (RootDescriptor *)
         std::vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_>::begin
                   ((vector<Remapper::RootDescriptor,_std::allocator<Remapper::RootDescriptor>_> *)
                    &binding_local[1].kind);
    dVar2 = __gnu_cxx::operator-(&local_30,&local_60);
    remapper_local._4_4_ = (int32_t)dVar2;
  }
  else {
    remapper_local._4_4_ = -1;
  }
  return remapper_local._4_4_;
}

Assistant:

static int32_t find_root_descriptor_index(const Remapper *remapper, const dxil_spv_d3d_binding *binding,
                                          dxil_spv_resource_class resource_class)
{
	auto itr = std::find_if(remapper->root_descriptors.begin(), remapper->root_descriptors.end(),
	                        [&](const Remapper::RootDescriptor &desc)
	                        {
	                          return desc.resource_class == resource_class &&
	                                 desc.space == binding->register_space &&
	                                 desc.register_index == binding->register_index;
	                        });

	if (itr != remapper->root_descriptors.end())
		return int32_t(itr - remapper->root_descriptors.begin());
	else
		return -1;
}